

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::MeshLoader::begin__polylist(MeshLoader *this,polylist__AttributeData *attributeData)

{
  GeometryMaterialIdInfo *this_00;
  MeshPrimitive *pMVar1;
  MaterialId MVar2;
  allocator<char> local_41;
  String local_40;
  
  this->mCurrentPrimitiveType = POLYLIST;
  pMVar1 = (MeshPrimitive *)operator_new(0x138);
  IFilePartLoader::createUniqueId((UniqueId *)&local_40,(IFilePartLoader *)this,PRIMITIVE_ELEMENT);
  COLLADAFW::Polylist::Polylist((Polylist *)pMVar1,(UniqueId *)&local_40);
  COLLADAFW::UniqueId::~UniqueId((UniqueId *)&local_40);
  COLLADAFW::ArrayPrimitiveType<int>::allocMemory
            ((ArrayPrimitiveType<int> *)(pMVar1 + 1),attributeData->count,1);
  this->mCurrentMeshPrimitive = pMVar1;
  if (attributeData->material != (char *)0x0) {
    this_00 = this->mMaterialIdInfo;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,attributeData->material,&local_41);
    MVar2 = GeometryMaterialIdInfo::getMaterialId(this_00,&local_40);
    pMVar1->mMaterialId = MVar2;
    std::__cxx11::string::~string((string *)&local_40);
    pMVar1 = this->mCurrentMeshPrimitive;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,attributeData->material,&local_41);
    std::__cxx11::string::_M_assign((string *)&pMVar1->mMaterial);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return true;
}

Assistant:

bool MeshLoader::begin__polylist( const polylist__AttributeData& attributeData )
	{
		mCurrentPrimitiveType = POLYLIST;
        COLLADAFW::Polylist* polylist = new COLLADAFW::Polylist(createUniqueId(COLLADAFW::Polylist::ID()));
		polylist->getGroupedVerticesVertexCountArray().allocMemory((size_t)attributeData.count);
		mCurrentMeshPrimitive = polylist;
		if ( attributeData.material )
		{
			mCurrentMeshPrimitive->setMaterialId(mMaterialIdInfo.getMaterialId( attributeData.material ));
			mCurrentMeshPrimitive->setMaterial(attributeData.material);

		}
		return true;
	}